

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void fread_pet(CHAR_DATA *ch,FILE *fp)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  MOB_INDEX_DATA *pMVar4;
  CHAR_DATA *pCVar5;
  AFFECT_DATA *pAVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  long *vector;
  int i;
  CHAR_DATA **ppCVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int vnum;
  int local_60;
  int local_5c;
  AFFECT_DATA *local_58;
  CHAR_DATA *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  local_60 = (int)current_time;
  iVar3 = feof((FILE *)fp);
  if (iVar3 == 0) {
    pcVar10 = fread_word(fp);
  }
  else {
    pcVar10 = "END";
  }
  bVar2 = str_cmp(pcVar10,"Vnum");
  if (bVar2) {
    fmt._M_str = "Fread_pet: no vnum in file.";
    fmt._M_len = 0x1b;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  }
  else {
    local_5c = fread_number(fp);
    pMVar4 = get_mob_index(0);
    if (pMVar4 == (MOB_INDEX_DATA *)0x0) {
      fmt_00._M_str = "Fread_pet: bad vnum {}.";
      fmt_00._M_len = 0x17;
      CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt_00,&local_5c);
    }
  }
  pMVar4 = get_mob_index(0);
  pCVar5 = create_mobile(pMVar4);
  local_38 = pCVar5->comm;
  local_40 = pCVar5->act;
  local_48 = pCVar5->affected_by;
  do {
    iVar3 = feof((FILE *)fp);
    pcVar10 = "END";
    if (iVar3 == 0) {
      pcVar10 = fread_word(fp);
    }
    cVar1 = *pcVar10;
    uVar8 = (int)cVar1 - 0x20U & 0xff;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      uVar8 = (int)cVar1;
    }
    bVar2 = false;
    switch(uVar8) {
    case 0x41:
      bVar2 = str_cmp(pcVar10,"Act");
      vector = local_40;
      if ((!bVar2) || (bVar2 = str_cmp(pcVar10,"AfBy"), vector = local_48, !bVar2)) {
LAB_002c22cf:
        fread_flag_new(vector,fp);
        break;
      }
      bVar2 = str_cmp(pcVar10,"Alig");
      if (!bVar2) {
        iVar3 = fread_number(fp);
        pCVar5->alignment = (short)iVar3;
        break;
      }
      bVar2 = str_cmp(pcVar10,"ACs");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"Affc");
        if (bVar2) {
          bVar2 = str_cmp(pcVar10,"AMod");
          if (bVar2) {
            bVar2 = str_cmp(pcVar10,"Attr");
            if (bVar2) goto LAB_002c224a;
            lVar7 = 0;
            do {
              iVar3 = fread_number(fp);
              pCVar5->perm_stat[lVar7] = (short)iVar3;
              lVar7 = lVar7 + 1;
              bVar2 = true;
            } while (lVar7 != 5);
          }
          else {
            lVar7 = 0;
            do {
              iVar3 = fread_number(fp);
              pCVar5->mod_stat[lVar7] = (short)iVar3;
              lVar7 = lVar7 + 1;
              bVar2 = true;
            } while (lVar7 != 5);
          }
        }
        else {
          pAVar6 = new_affect();
          init_affect(pAVar6);
          pcVar10 = fread_word(fp);
          iVar3 = skill_lookup(pcVar10);
          local_50 = ch;
          if (iVar3 < 0) {
            fmt_02._M_str = "Fread_char: unknown skill.";
            fmt_02._M_len = 0x1a;
            CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_02);
          }
          else {
            pAVar6->type = (short)iVar3;
          }
          iVar3 = fread_number(fp);
          pAVar6->where = (short)iVar3;
          iVar3 = fread_number(fp);
          pAVar6->level = (short)iVar3;
          iVar3 = fread_number(fp);
          pAVar6->duration = (short)iVar3;
          iVar3 = fread_number(fp);
          pAVar6->modifier = (short)iVar3;
          iVar3 = fread_number(fp);
          pAVar6->location = (short)iVar3;
          fread_flag_new(pAVar6->bitvector,fp);
          iVar3 = fread_number(fp);
          pAVar6->aftype = iVar3;
          pcVar10 = fread_word(fp);
          iVar3 = strcmp(pcVar10,"none");
          if (iVar3 != 0) {
            pAVar6->owner = local_50;
          }
          ppCVar11 = &char_list;
          local_58 = pAVar6;
          do {
            ppCVar11 = &((CHAR_DATA *)ppCVar11)->next->next;
            if ((CHAR_DATA *)ppCVar11 == (CHAR_DATA *)0x0) goto LAB_002c246c;
            bVar2 = str_cmp(((CHAR_DATA *)ppCVar11)->name,pcVar10);
          } while (bVar2);
          local_58->owner = (CHAR_DATA *)ppCVar11;
LAB_002c246c:
          pcVar10 = fread_word(fp);
          bVar2 = str_cmp(pcVar10,"none");
          pAVar6 = local_58;
          if (bVar2) {
            pcVar10 = palloc_string(pcVar10);
            pAVar6->name = pcVar10;
          }
          pAVar6->next = pCVar5->affected;
          pCVar5->affected = pAVar6;
          bVar2 = true;
          ch = local_50;
        }
      }
      else {
        lVar7 = 0;
        do {
          iVar3 = fread_number(fp);
          pCVar5->armor[lVar7] = (short)iVar3;
          lVar7 = lVar7 + 1;
          bVar2 = true;
        } while (lVar7 != 4);
      }
    case 0x42:
    case 0x46:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4f:
    case 0x51:
      goto switchD_002c1ec6_caseD_42;
    case 0x43:
      bVar2 = str_cmp(pcVar10,"Comm");
      vector = local_38;
      if (!bVar2) goto LAB_002c22cf;
      bVar2 = str_cmp(pcVar10,"Cabal");
      if (bVar2) goto LAB_002c224a;
      pcVar10 = fread_string(fp);
      iVar3 = cabal_lookup(pcVar10);
      pCVar5->cabal = (short)iVar3;
      break;
    case 0x44:
      bVar2 = str_cmp(pcVar10,"Dam");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"Desc");
        if (bVar2) goto LAB_002c224a;
        pcVar10 = fread_string(fp);
        pCVar5->description = pcVar10;
      }
      else {
        iVar3 = fread_number(fp);
        pCVar5->damroll = (short)iVar3;
      }
      break;
    case 0x45:
      bVar2 = str_cmp(pcVar10,"End");
      if (!bVar2) {
        pCVar5->leader = ch;
        pCVar5->master = ch;
        ch->pet = pCVar5;
        lVar7 = CONCAT44(current_time._4_4_,(int)current_time) - (long)local_60;
        iVar3 = (int)((ulong)(lVar7 / 0x12 + (lVar7 >> 0x3f)) >> 4) - (int)(lVar7 >> 0x3f);
        if (((0 < iVar3) && (bVar2 = is_affected_by(ch,0xc), !bVar2)) &&
           (bVar2 = is_affected_by(ch,0x17), !bVar2)) {
          iVar9 = 100;
          if (iVar3 < 100) {
            iVar9 = iVar3;
          }
          pCVar5->hit = (((int)pCVar5->max_hit - pCVar5->hit) * iVar9) / 100 + pCVar5->hit;
          iVar3 = ((int)pCVar5->max_mana - (int)pCVar5->mana) * iVar9;
          pCVar5->mana = ((short)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x25) -
                         (short)(iVar3 >> 0x1f)) + pCVar5->mana;
          iVar9 = ((int)pCVar5->max_move - (int)pCVar5->move) * iVar9;
          pCVar5->move = ((short)(uint)((ulong)((long)iVar9 * 0x51eb851f) >> 0x25) -
                         (short)(iVar9 >> 0x1f)) + pCVar5->move;
        }
        return;
      }
      bVar2 = str_cmp(pcVar10,"Exp");
      if (!bVar2) {
        iVar3 = fread_number(fp);
        pCVar5->exp = iVar3;
        break;
      }
LAB_002c224a:
      bVar2 = false;
      goto switchD_002c1ec6_caseD_42;
    case 0x47:
      bVar2 = str_cmp(pcVar10,"Gold");
      if (bVar2) goto LAB_002c224a;
      iVar3 = fread_number(fp);
      pCVar5->gold = (long)iVar3;
      break;
    case 0x48:
      bVar2 = str_cmp(pcVar10,"Hit");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"HMV");
        if (bVar2) goto LAB_002c224a;
        iVar3 = fread_number(fp);
        pCVar5->hit = iVar3;
        iVar3 = fread_number(fp);
        pCVar5->max_hit = (short)iVar3;
        iVar3 = fread_number(fp);
        pCVar5->mana = (short)iVar3;
        iVar3 = fread_number(fp);
        pCVar5->max_mana = (short)iVar3;
        iVar3 = fread_number(fp);
        pCVar5->move = (short)iVar3;
        iVar3 = fread_number(fp);
        pCVar5->max_move = (short)iVar3;
      }
      else {
        iVar3 = fread_number(fp);
        pCVar5->hitroll = (short)iVar3;
      }
      break;
    case 0x4c:
      bVar2 = str_cmp(pcVar10,"Levl");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"LnD");
        if (bVar2) {
          bVar2 = str_cmp(pcVar10,"LogO");
          if (bVar2) goto LAB_002c224a;
          local_60 = fread_number(fp);
        }
        else {
          pcVar10 = fread_string(fp);
          pCVar5->long_descr = pcVar10;
        }
      }
      else {
        iVar3 = fread_number(fp);
        pCVar5->level = (short)iVar3;
      }
      break;
    case 0x4e:
      bVar2 = str_cmp(pcVar10,"Name");
      if (bVar2) goto LAB_002c224a;
      pcVar10 = fread_string(fp);
      pCVar5->name = pcVar10;
      break;
    case 0x50:
      bVar2 = str_cmp(pcVar10,"Pos");
      if (bVar2) goto LAB_002c224a;
      iVar3 = fread_number(fp);
      pCVar5->position = (short)iVar3;
      break;
    case 0x52:
      bVar2 = str_cmp(pcVar10,"Race");
      if (bVar2) goto LAB_002c224a;
      pcVar10 = fread_string(fp);
      iVar3 = race_lookup(pcVar10);
      pCVar5->race = (short)iVar3;
      break;
    case 0x53:
      bVar2 = str_cmp(pcVar10,"Save");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"Sex");
        if (bVar2) {
          bVar2 = str_cmp(pcVar10,"ShD");
          if (bVar2) goto LAB_002c224a;
          pcVar10 = fread_string(fp);
          pCVar5->short_descr = pcVar10;
        }
        else {
          iVar3 = fread_number(fp);
          pCVar5->sex = (short)iVar3;
        }
      }
      else {
        iVar3 = fread_number(fp);
        pCVar5->saving_throw = (short)iVar3;
      }
      break;
    default:
      bVar2 = false;
      if (uVar8 == 0x2a) {
        fread_to_eol(fp);
        break;
      }
      goto switchD_002c1ec6_caseD_42;
    }
    bVar2 = true;
switchD_002c1ec6_caseD_42:
    if (!bVar2) {
      fmt_01._M_str = "Fread_pet: no match.";
      fmt_01._M_len = 0x14;
      CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt_01);
      fread_to_eol(fp);
    }
  } while( true );
}

Assistant:

void fread_pet(CHAR_DATA *ch, FILE *fp)
{
	char *word;
	CHAR_DATA *pet;
	bool fMatch;
	int lastlogoff = current_time;
	int percent;

	/* first entry had BETTER be the vnum or we barf */
	word = feof(fp) ? (char *)"END" : fread_word(fp);

	if (!str_cmp(word, "Vnum"))
	{
		int vnum;

		vnum = fread_number(fp);

		if (get_mob_index(vnum) == nullptr)
		{
			RS.Logger.Warn("Fread_pet: bad vnum {}.", vnum);
			pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
		}
		else
		{
			pet = create_mobile(get_mob_index(vnum));
		}
	}
	else
	{
		RS.Logger.Warn("Fread_pet: no vnum in file.");
		pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
	}

	for (;;)
	{
		word = feof(fp) ? (char *)"END" : fread_word(fp);
		fMatch = false;

		switch (UPPER(word[0]))
		{
			case '*':
				fMatch = true;
				fread_to_eol(fp);
				break;
			case 'A':
				KEYV("Act", pet->act)
				KEYV("AfBy", pet->affected_by)
				KEY("Alig", pet->alignment, fread_number(fp))

				if (!str_cmp(word, "ACs"))
				{
					int i;

					for (i = 0; i < 4; i++)
					{
						pet->armor[i] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Affc"))
				{
					CHAR_DATA *wch = nullptr;
					char *owner;
					char *afname;
					AFFECT_DATA *paf;
					int sn;

					paf = new_affect();
					init_affect(paf);
					sn = skill_lookup(fread_word(fp));

					if (sn < 0)
						RS.Logger.Warn("Fread_char: unknown skill.");
					else
						paf->type = sn;

					paf->where = fread_number(fp);
					paf->level = fread_number(fp);
					paf->duration = fread_number(fp);
					paf->modifier = fread_number(fp);
					paf->location = fread_number(fp);

					fread_flag_new(paf->bitvector, fp);

					paf->aftype = fread_number(fp);

					owner = fread_word(fp);

					if (strcmp(owner, "none")) // safe default
						paf->owner = ch;

					for (wch = char_list; wch; wch = wch->next)
					{
						if (!str_cmp(wch->name, owner))
						{
							paf->owner = wch;
							break;
						}
					}

					afname = fread_word(fp);

					if (str_cmp(afname, "none"))
						paf->name = palloc_string(afname);

					paf->next = pet->affected;
					pet->affected = paf;
					fMatch = true;
					break;
				}

				if (!str_cmp(word, "AMod"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->mod_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Attr"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->perm_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				break;
			case 'C':
				KEYV("Comm", pet->comm)
				KEY("Cabal", pet->cabal, cabal_lookup(fread_string(fp)))
				break;
			case 'D':
				KEY("Dam", pet->damroll, fread_number(fp))
				KEY("Desc", pet->description, fread_string(fp))
				break;
			case 'E':
				if (!str_cmp(word, "End"))
				{
					pet->leader = ch;
					pet->master = ch;
					ch->pet = pet;
					/* adjust hp mana move up  -- here for speed's sake */
					percent = (current_time - lastlogoff) * 25 / (2 * 60 * 60);

					if (percent > 0 && !is_affected_by(ch, AFF_POISON) && !is_affected_by(ch, AFF_PLAGUE))
					{
						percent = std::min(percent, 100);
						pet->hit += (pet->max_hit - pet->hit) * percent / 100;
						pet->mana += (pet->max_mana - pet->mana) * percent / 100;
						pet->move += (pet->max_move - pet->move) * percent / 100;
					}

					return;
				}

				KEY("Exp", pet->exp, fread_number(fp))
				break;
			case 'G':
				KEY("Gold", pet->gold, fread_number(fp))
				break;
			case 'H':
				KEY("Hit", pet->hitroll, fread_number(fp))

				if (!str_cmp(word, "HMV"))
				{
					pet->hit = fread_number(fp);
					pet->max_hit = fread_number(fp);
					pet->mana = fread_number(fp);
					pet->max_mana = fread_number(fp);
					pet->move = fread_number(fp);
					pet->max_move = fread_number(fp);
					fMatch = true;
					break;
				}

				break;
			case 'L':
				KEY("Levl", pet->level, fread_number(fp))
				KEY("LnD", pet->long_descr, fread_string(fp))
				KEY("LogO", lastlogoff, fread_number(fp))
				break;
			case 'N':
				KEY("Name", pet->name, fread_string(fp))
				break;
			case 'P':
				KEY("Pos", pet->position, fread_number(fp))
				break;
			case 'R':
				KEY("Race", pet->race, race_lookup(fread_string(fp)))
				break;
			case 'S':
				KEY("Save", pet->saving_throw, fread_number(fp))
				KEY("Sex", pet->sex, fread_number(fp))
				KEY("ShD", pet->short_descr, fread_string(fp))
				break;
		}

		if (!fMatch)
		{
			RS.Logger.Warn("Fread_pet: no match.");
			fread_to_eol(fp);
		}
	}
}